

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O2

void getopt_add_bool(getopt_t *gopt,char sopt,char *lname,int def,char *help)

{
  int iVar1;
  getopt_option_t *pgVar2;
  char *pcVar3;
  char sname [2];
  char *lname_local;
  char *sname_ptr;
  getopt_option_t *goo;
  
  sname_ptr = sname;
  sname[1] = '\0';
  sname[0] = sopt;
  lname_local = lname;
  if (*lname == '\0') {
    fwrite("getopt_add_bool(): must supply option name\n",0x2b,1,_stderr);
  }
  else if (sopt == '-') {
    fprintf(_stderr,"getopt_add_bool(): invalid option character: \'%c\'\n",0x2d);
  }
  else {
    iVar1 = zhash_contains(gopt->lopts,&lname_local);
    if (iVar1 == 0) {
      if (sopt != '\0') {
        iVar1 = zhash_contains(gopt->sopts,&sname_ptr);
        if (iVar1 != 0) {
          fprintf(_stderr,"getopt_add_bool(): duplicate option: -%s (\'%s\')\n",sname,lname_local);
          goto LAB_003c46b2;
        }
      }
      pgVar2 = (getopt_option_t *)calloc(1,0x30);
      goo = pgVar2;
      pcVar3 = strdup(sname);
      pgVar2->sname = pcVar3;
      pcVar3 = strdup(lname_local);
      pgVar2->lname = pcVar3;
      pcVar3 = "true";
      if (def == 0) {
        pcVar3 = "false";
      }
      pcVar3 = strdup(pcVar3);
      pgVar2->svalue = pcVar3;
      pgVar2->type = 1;
      pcVar3 = strdup(help);
      pgVar2->help = pcVar3;
      zhash_put(gopt->lopts,&pgVar2->lname,&goo,(void *)0x0,(void *)0x0);
      zhash_put(gopt->sopts,goo,&goo,(void *)0x0,(void *)0x0);
      zarray_add(gopt->options,&goo);
      return;
    }
    fprintf(_stderr,"getopt_add_bool(): duplicate option name: --%s\n",lname_local);
  }
LAB_003c46b2:
  exit(1);
}

Assistant:

void getopt_add_bool(getopt_t *gopt, char sopt, const char *lname, int def, const char *help)
{
    char sname[2];
    sname[0] = sopt;
    sname[1] = 0;
    char *sname_ptr = (char*) &sname;

    if (strlen(lname) < 1) { // must have long name
        fprintf (stderr, "getopt_add_bool(): must supply option name\n");
        exit (EXIT_FAILURE);
    }

    if (sopt == '-') { // short name cannot be '-' (no way to reference)
        fprintf (stderr, "getopt_add_bool(): invalid option character: '%c'\n", sopt);
        exit (EXIT_FAILURE);
    }

    if (zhash_contains(gopt->lopts, &lname)) {
        fprintf (stderr, "getopt_add_bool(): duplicate option name: --%s\n", lname);
        exit (EXIT_FAILURE);
    }

    if (sopt != '\0' && zhash_contains(gopt->sopts, &sname_ptr)) {
        fprintf (stderr, "getopt_add_bool(): duplicate option: -%s ('%s')\n", sname, lname);
        exit (EXIT_FAILURE);
    }

    getopt_option_t *goo = (getopt_option_t*) calloc(1, sizeof(getopt_option_t));
    goo->sname=strdup(sname);
    goo->lname=strdup(lname);
    goo->svalue=strdup(def ? "true" : "false");
    goo->type=GOO_BOOL_TYPE;
    goo->help=strdup(help);

    zhash_put(gopt->lopts, &goo->lname, &goo, NULL, NULL);
    zhash_put(gopt->sopts, &goo->sname, &goo, NULL, NULL);
    zarray_add(gopt->options, &goo);
}